

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PCI.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::TagBox>::PC_local_cpu
          (FabArray<amrex::TagBox> *this,CPC *thecpc,FabArray<amrex::TagBox> *src,int scomp,
          int dcomp,int ncomp,CpOp op)

{
  Box *pBVar1;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar2;
  pointer pFVar3;
  TagBox *pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pVVar7;
  bool bVar8;
  BaseFab<char> *src_00;
  BaseFab<char> *this_00;
  vector<amrex::FabCopyTag<amrex::TagBox>,std::allocator<amrex::FabCopyTag<amrex::TagBox>>> *this_01
  ;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  FabCopyTag<amrex::TagBox> *tag;
  ulong uVar14;
  pointer pFVar15;
  Array4<char> dfab;
  MFIter mfi;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>
  loc_copy_tags;
  anon_class_152_5_ce3dc6ec local_288;
  FabArray<amrex::TagBox> *local_1e8;
  Array4<char> local_1e0;
  MFIter local_1a0;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>
  local_140;
  
  pvVar2 = (thecpc->super_CommMetaData).m_LocTags._M_t.
           super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           .
           super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
           ._M_head_impl;
  uVar10 = (ulong)((long)*(pointer *)
                          ((long)&(pvVar2->
                                  super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                  )._M_impl + 8) -
                  *(long *)&(pvVar2->
                            super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                            )._M_impl) >> 6;
  iVar9 = (int)uVar10;
  if (iVar9 != 0) {
    if ((thecpc->super_CommMetaData).m_threadsafe_loc == true) {
      uVar14 = 0;
      uVar10 = uVar10 & 0xffffffff;
      if (iVar9 < 1) {
        uVar10 = uVar14;
      }
      for (; uVar10 << 6 != uVar14; uVar14 = uVar14 + 0x40) {
        lVar11 = *(long *)&(((thecpc->super_CommMetaData).m_LocTags._M_t.
                             super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                            ._M_head_impl)->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl;
        pBVar1 = (Box *)(lVar11 + uVar14);
        if ((this == src) && (*(int *)(lVar11 + 0x38 + uVar14) == *(int *)(lVar11 + 0x3c + uVar14)))
        {
          bVar8 = Box::operator!=((Box *)(lVar11 + uVar14 + 0x1c),pBVar1);
          if (bVar8) goto LAB_0046b552;
        }
        else {
LAB_0046b552:
          lVar11 = lVar11 + uVar14;
          src_00 = &fabPtr(src,*(int *)(lVar11 + 0x3c))->super_BaseFab<char>;
          this_00 = &fabPtr(this,*(int *)(lVar11 + 0x38))->super_BaseFab<char>;
          if (op == COPY) {
            BaseFab<char>::copy<(amrex::RunOn)1>
                      (this_00,src_00,(Box *)(lVar11 + 0x1c),scomp,pBVar1,dcomp,ncomp);
          }
          else {
            BaseFab<char>::plus<(amrex::RunOn)1>
                      (this_00,src_00,(Box *)(lVar11 + 0x1c),pBVar1,scomp,dcomp,ncomp);
          }
        }
      }
    }
    else {
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>
      ::LayoutData(&local_140,&(this->super_FabArrayBase).boxarray,
                   &(this->super_FabArrayBase).distributionMap);
      uVar14 = 0;
      uVar10 = uVar10 & 0xffffffff;
      if (iVar9 < 1) {
        uVar10 = uVar14;
      }
      for (; uVar10 << 6 != uVar14; uVar14 = uVar14 + 0x40) {
        lVar11 = *(long *)&(((thecpc->super_CommMetaData).m_LocTags._M_t.
                             super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                            ._M_head_impl)->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl;
        pBVar1 = (Box *)(uVar14 + lVar11);
        if ((this == src) && (*(int *)(lVar11 + 0x38 + uVar14) == *(int *)(lVar11 + 0x3c + uVar14)))
        {
          bVar8 = Box::operator!=((Box *)(uVar14 + lVar11 + 0x1c),pBVar1);
          if (bVar8) goto LAB_0046b636;
        }
        else {
LAB_0046b636:
          this_01 = (vector<amrex::FabCopyTag<amrex::TagBox>,std::allocator<amrex::FabCopyTag<amrex::TagBox>>>
                     *)LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>
                       ::operator[](&local_140,*(int *)(lVar11 + 0x38 + uVar14));
          local_288.dfab.p = (char *)fabPtr(src,*(int *)(lVar11 + 0x3c + uVar14));
          local_288.dfab.jstride = *(Long *)(pBVar1->smallend).vect;
          uVar5 = *(undefined8 *)(pBVar1->bigend).vect;
          uVar6 = *(undefined8 *)((pBVar1->bigend).vect + 2);
          local_288.dfab.kstride._0_4_ = (undefined4)*(undefined8 *)((pBVar1->smallend).vect + 2);
          local_288.dfab.kstride._4_4_ = (undefined4)uVar5;
          local_288.dfab.nstride._0_4_ = (undefined4)((ulong)uVar5 >> 0x20);
          local_288.dfab.nstride._4_4_ = (undefined4)uVar6;
          local_288.dfab.begin.x = (int)((ulong)uVar6 >> 0x20);
          local_288.dfab.begin.y = *(int *)(lVar11 + 0x1c + uVar14) - *(int *)(lVar11 + uVar14);
          local_288.dfab.begin.z = *(int *)(lVar11 + 0x20 + uVar14) - *(int *)(lVar11 + 4 + uVar14);
          local_288.dfab.end.x = *(int *)(lVar11 + 0x24 + uVar14) - *(int *)(lVar11 + 8 + uVar14);
          std::
          vector<amrex::FabCopyTag<amrex::TagBox>,std::allocator<amrex::FabCopyTag<amrex::TagBox>>>
          ::emplace_back<amrex::FabCopyTag<amrex::TagBox>>
                    (this_01,(FabCopyTag<amrex::TagBox> *)&local_288);
        }
      }
      MFIter::MFIter(&local_1a0,&this->super_FabArrayBase,'\0');
      local_1e8 = this;
      while( true ) {
        pVVar7 = local_140.m_data.
                 super_vector<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_1a0.endIndex <= local_1a0.currentIndex) break;
        iVar9 = local_1a0.currentIndex;
        if (local_1a0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar9 = ((local_1a0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[local_1a0.currentIndex];
        }
        array<amrex::TagBox,_0>(&local_1e0,local_1e8,&local_1a0);
        pFVar15 = pVVar7[iVar9].
                  super_vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>
                  .
                  super__Vector_base<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pFVar3 = pVVar7[iVar9].
                 super_vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>
                 .
                 super__Vector_base<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (op == COPY) {
          for (; pFVar15 != pFVar3; pFVar15 = pFVar15 + 1) {
            pTVar4 = pFVar15->sfab;
            local_288.offset.x = (pFVar15->offset).vect[0];
            local_288.offset.y = (pFVar15->offset).vect[1];
            local_288.sfab.p = (pTVar4->super_BaseFab<char>).dptr;
            local_288.sfab.ncomp = (pTVar4->super_BaseFab<char>).nvar;
            pBVar1 = &(pTVar4->super_BaseFab<char>).domain;
            local_288.sfab.begin.z = (pTVar4->super_BaseFab<char>).domain.smallend.vect[2];
            local_288.sfab.begin.x = (pBVar1->smallend).vect[0];
            local_288.sfab.begin.y = (pBVar1->smallend).vect[1];
            lVar12 = (long)(pTVar4->super_BaseFab<char>).domain.bigend.vect[1] + 1;
            lVar13 = (long)(pTVar4->super_BaseFab<char>).domain.bigend.vect[0];
            lVar11 = (long)(pTVar4->super_BaseFab<char>).domain.bigend.vect[2] + 1;
            local_288.sfab.jstride = (lVar13 - (pBVar1->smallend).vect[0]) + 1;
            local_288.sfab.kstride =
                 (lVar12 - (pTVar4->super_BaseFab<char>).domain.smallend.vect[1]) *
                 local_288.sfab.jstride;
            local_288.sfab.nstride = (lVar11 - local_288.sfab.begin.z) * local_288.sfab.kstride;
            local_288.sfab.end._0_8_ = lVar13 + 1U & 0xffffffff | lVar12 << 0x20;
            local_288.offset.z = (pFVar15->offset).vect[2];
            local_288.dfab.end.z = local_1e0.end.z;
            local_288.dfab.ncomp = local_1e0.ncomp;
            local_288.dfab.begin.x = local_1e0.begin.x;
            local_288.dfab.begin.y = local_1e0.begin.y;
            local_288.dfab.begin.z = local_1e0.begin.z;
            local_288.dfab.end.x = local_1e0.end.x;
            local_288.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
            local_288.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
            local_288.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
            local_288.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
            local_288.dfab.p = local_1e0.p;
            local_288.dfab.jstride = local_1e0.jstride;
            local_288.sfab.end.z = (int)lVar11;
            local_288.dcomp = dcomp;
            local_288.scomp = scomp;
            LoopConcurrentOnCpu<amrex::FabArray<amrex::TagBox>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::TagBox>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_1_>
                      (&pFVar15->dbox,ncomp,&local_288);
          }
        }
        else {
          for (; pFVar15 != pFVar3; pFVar15 = pFVar15 + 1) {
            pTVar4 = pFVar15->sfab;
            local_288.offset.x = (pFVar15->offset).vect[0];
            local_288.offset.y = (pFVar15->offset).vect[1];
            local_288.sfab.p = (pTVar4->super_BaseFab<char>).dptr;
            local_288.sfab.ncomp = (pTVar4->super_BaseFab<char>).nvar;
            pBVar1 = &(pTVar4->super_BaseFab<char>).domain;
            local_288.sfab.begin.z = (pTVar4->super_BaseFab<char>).domain.smallend.vect[2];
            local_288.sfab.begin.x = (pBVar1->smallend).vect[0];
            local_288.sfab.begin.y = (pBVar1->smallend).vect[1];
            lVar11 = (long)(pTVar4->super_BaseFab<char>).domain.bigend.vect[1] + 1;
            iVar9 = (pTVar4->super_BaseFab<char>).domain.bigend.vect[0];
            lVar12 = (long)(pTVar4->super_BaseFab<char>).domain.bigend.vect[2] + 1;
            local_288.sfab.jstride = ((long)iVar9 - (long)(pBVar1->smallend).vect[0]) + 1;
            local_288.sfab.kstride =
                 (lVar11 - (pTVar4->super_BaseFab<char>).domain.smallend.vect[1]) *
                 local_288.sfab.jstride;
            local_288.sfab.nstride = (lVar12 - local_288.sfab.begin.z) * local_288.sfab.kstride;
            local_288.sfab.end._0_8_ = (ulong)(iVar9 + 1) | lVar11 << 0x20;
            local_288.offset.z = (pFVar15->offset).vect[2];
            local_288.dfab.end.z = local_1e0.end.z;
            local_288.dfab.ncomp = local_1e0.ncomp;
            local_288.dfab.begin.x = local_1e0.begin.x;
            local_288.dfab.begin.y = local_1e0.begin.y;
            local_288.dfab.begin.z = local_1e0.begin.z;
            local_288.dfab.end.x = local_1e0.end.x;
            local_288.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
            local_288.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
            local_288.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
            local_288.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
            local_288.dfab.p = local_1e0.p;
            local_288.dfab.jstride = local_1e0.jstride;
            local_288.sfab.end.z = (int)lVar12;
            local_288.dcomp = dcomp;
            local_288.scomp = scomp;
            LoopConcurrentOnCpu<amrex::FabArray<amrex::TagBox>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::TagBox>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_2_>
                      (&pFVar15->dbox,ncomp,&local_288);
          }
        }
        MFIter::operator++(&local_1a0);
      }
      MFIter::~MFIter(&local_1a0);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::TagBox>,_std::allocator<amrex::FabCopyTag<amrex::TagBox>_>_>_>
      ::~LayoutData(&local_140);
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::PC_local_cpu (const CPC& thecpc, FabArray<FAB> const& src,
                             int scomp, int dcomp, int ncomp, CpOp op)
{
    int N_locs = thecpc.m_LocTags->size();
    if (N_locs == 0) return;
    bool is_thread_safe = thecpc.m_threadsafe_loc;

    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                // avoid self copy or plus
                const FAB* sfab = &(src[tag.srcIndex]);
                      FAB* dfab = &(get(tag.dstIndex));
                if (op == FabArrayBase::COPY)
                {
                    dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, dcomp, ncomp);
                }
                else
                {
                    dfab->template plus<RunOn::Host>(*sfab, tag.sbox, tag.dbox, scomp, dcomp, ncomp);
                }
            }
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                loc_copy_tags[tag.dstIndex].push_back
                    ({src.fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            if (op == FabArrayBase::COPY)
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) = sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
            else
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) += sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
        }
    }
}